

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluVarTypeUtil.hpp
# Opt level: O3

SubTypeIterator<glu::IsBasicType> * __thiscall
glu::SubTypeIterator<glu::IsBasicType>::operator++
          (SubTypeIterator<glu::IsBasicType> *__return_storage_ptr__,
          SubTypeIterator<glu::IsBasicType> *this,int param_1)

{
  __return_storage_ptr__->m_type = this->m_type;
  std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>::vector
            (&__return_storage_ptr__->m_path,&this->m_path);
  operator++(this);
  return __return_storage_ptr__;
}

Assistant:

SubTypeIterator<IsExpanded>			operator++			(int)	{ SubTypeIterator<IsExpanded> copy(*this); ++(*this); return copy; }